

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

bool RegexTree::nullable(tree_node *ptr)

{
  bool bVar1;
  bool local_1a;
  bool local_19;
  tree_node *ptr_local;
  
  if (ptr->c == '\a') {
    ptr_local._7_1_ = true;
  }
  else if ((ptr->left == (tree_node *)0x0) && (ptr->right == (tree_node *)0x0)) {
    ptr_local._7_1_ = false;
  }
  else if (ptr->c == '\n') {
    bVar1 = nullable(ptr->left);
    local_19 = true;
    if (!bVar1) {
      local_19 = nullable(ptr->right);
    }
    ptr_local._7_1_ = local_19;
  }
  else if (ptr->c == '\b') {
    bVar1 = nullable(ptr->left);
    local_1a = false;
    if (bVar1) {
      local_1a = nullable(ptr->right);
    }
    ptr_local._7_1_ = local_1a;
  }
  else {
    ptr_local._7_1_ = ptr->c == '\t';
  }
  return ptr_local._7_1_;
}

Assistant:

bool RegexTree::nullable(const tree_node *ptr) {
    if (ptr->c == EPSILON) return true;

    if (ptr->left == nullptr && ptr->right == nullptr) return false;
    if (ptr->c == OR)
        return nullable(ptr->left) || nullable(ptr->right);
    if (ptr->c == CAT)
        return nullable(ptr->left) && nullable(ptr->right);
    return ptr->c == STAR;
}